

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classical_ising_polynomial.hpp
# Opt level: O2

void __thiscall
openjij::test::PolySystemCIP_ConstructorCimodDenseTuple2_Test::TestBody
          (PolySystemCIP_ConstructorCimodDenseTuple2_Test *this)

{
  allocator<char> local_81;
  _Hashtable<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_double>,_std::allocator<std::pair<const_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_80;
  string local_48;
  string local_28;
  
  GeneratePolynomialInteractionsDenseTuple2<double>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"Dense",&local_81);
  TestCIPConstructorCimod<std::tuple<unsigned_long,unsigned_long>,double>
            ((Polynomial<std::tuple<unsigned_long,_unsigned_long>,_double> *)&local_80,SPIN,
             &local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::
  _Hashtable<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_double>,_std::allocator<std::pair<const_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_80);
  GeneratePolynomialInteractionsDenseTuple2<double>();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Dense",&local_81);
  TestCIPConstructorCimod<std::tuple<unsigned_long,unsigned_long>,double>
            ((Polynomial<std::tuple<unsigned_long,_unsigned_long>,_double> *)&local_80,BINARY,
             &local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::
  _Hashtable<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_double>,_std::allocator<std::pair<const_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_80);
  return;
}

Assistant:

TEST(PolySystemCIP, ConstructorCimodDenseTuple2) {
   TestCIPConstructorCimod<std::tuple<openjij::graph::Index, openjij::graph::Index>, double>(GeneratePolynomialInteractionsDenseTuple2<double>(), cimod::Vartype::SPIN, "Dense");
   TestCIPConstructorCimod<std::tuple<openjij::graph::Index, openjij::graph::Index>, double>(GeneratePolynomialInteractionsDenseTuple2<double>(), cimod::Vartype::BINARY, "Dense");
}